

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O3

void __thiscall SceneRender::render(SceneRender *this,Uniforms *_uniforms)

{
  Tracker *this_00;
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  Camera *_camera;
  long lVar8;
  Fbo *_fbo;
  size_t _texLoc;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float *pfVar22;
  long *plVar23;
  _Base_ptr p_Var24;
  size_type *psVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  mat<4,_4,_float,_(glm::qualifier)0> Result;
  undefined1 local_138 [8];
  undefined8 uStack_130;
  undefined1 local_128 [8];
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  string local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  size_type local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  string local_98;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  _Rb_tree_node_base *local_38;
  
  renderBackground(this,_uniforms);
  if (this->m_depth_test == true) {
    glEnable(0xb71);
  }
  vera::blendMode(this->m_blend);
  _camera = (_uniforms->super_Scene).activeCamera;
  if (((_camera->super_Node).bChange != false) || ((this->m_origin).bChange == true)) {
    vera::setCamera(_camera);
    vera::applyMatrix(&(this->m_origin).m_transformMatrix);
  }
  this_00 = &_uniforms->tracker;
  if ((_uniforms->tracker).m_running == true) {
    local_138 = (undefined1  [8])local_128;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"render:scene:floor","");
    Tracker::begin(this_00,(string *)local_138);
    if (local_138 != (undefined1  [8])local_128) {
      operator_delete((void *)local_138,(long)local_128 + 1);
    }
  }
  renderFloor(this,_uniforms);
  if ((_uniforms->tracker).m_running == true) {
    local_138 = (undefined1  [8])local_128;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"render:scene:floor","");
    Tracker::end(this_00,(string *)local_138);
    if (local_138 != (undefined1  [8])local_128) {
      operator_delete((void *)local_138,(long)local_128 + 1);
    }
  }
  vera::cullingMode(this->m_culling);
  p_Var24 = (_uniforms->super_Scene).models._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_38 = &(_uniforms->super_Scene).models._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var24 != local_38) {
    do {
      if ((_uniforms->tracker).m_running == true) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_138,"render:scene:",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (*(long *)(p_Var24 + 2) + 0x2b0));
        Tracker::begin(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_138);
        if (local_138 != (undefined1  [8])local_128) {
          operator_delete((void *)local_138,(long)local_128 + 1);
        }
      }
      vera::Shader::use((Shader *)(*(long *)(p_Var24 + 2) + 0x158));
      (*(_uniforms->super_Scene)._vptr_Scene[0x3e])(_uniforms,*(long *)(p_Var24 + 2) + 0x158,1);
      lVar8 = *(long *)(p_Var24 + 2);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,"u_modelViewProjectionMatrix","");
      vera::getProjectionViewWorldMatrix();
      pfVar22 = (float *)(**(code **)(**(long **)(p_Var24 + 2) + 0x100))();
      fVar30 = SUB84(local_98._M_dataplus._M_p,0);
      fVar31 = (float)((ulong)local_98._M_dataplus._M_p >> 0x20);
      fVar34 = (float)local_98._M_string_length;
      fVar35 = (float)(local_98._M_string_length >> 0x20);
      local_b8 = local_98._M_string_length;
      uStack_b0 = 0;
      fVar36 = (float)local_98.field_2._8_8_;
      fVar37 = (float)((ulong)local_98.field_2._8_8_ >> 0x20);
      local_c8 = local_98.field_2._8_8_;
      uStack_c0 = 0;
      fVar26 = (float)local_78;
      fVar27 = (float)((ulong)local_78 >> 0x20);
      local_a8 = local_78;
      uStack_a0 = 0;
      fVar40 = (float)local_70;
      fVar41 = (float)((ulong)local_70 >> 0x20);
      local_48 = local_70;
      uStack_40 = 0;
      fVar28 = (float)local_68;
      fVar29 = (float)((ulong)local_68 >> 0x20);
      fVar38 = (float)local_60;
      fVar39 = (float)((ulong)local_60 >> 0x20);
      local_58 = local_60;
      uStack_50 = 0;
      fVar9 = *pfVar22;
      fVar10 = pfVar22[1];
      fVar11 = pfVar22[2];
      fVar12 = pfVar22[3];
      fVar13 = pfVar22[4];
      fVar14 = pfVar22[5];
      local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_98._M_dataplus._M_p;
      uStack_d0 = 0;
      fVar32 = (float)local_98.field_2._M_allocated_capacity;
      fVar33 = (float)((ulong)local_98.field_2._0_8_ >> 0x20);
      fVar15 = pfVar22[6];
      fVar16 = pfVar22[7];
      fVar17 = pfVar22[8];
      fVar18 = pfVar22[9];
      fVar19 = pfVar22[10];
      fVar20 = pfVar22[0xb];
      fVar21 = pfVar22[0xc];
      fVar1 = pfVar22[0xd];
      fVar2 = pfVar22[0xe];
      fVar3 = pfVar22[0xf];
      local_138._4_4_ = fVar29 * fVar12 + fVar27 * fVar11 + fVar33 * fVar10 + fVar31 * fVar9;
      local_138._0_4_ = fVar28 * fVar12 + fVar26 * fVar11 + fVar32 * fVar10 + fVar30 * fVar9;
      uStack_130 = CONCAT44(fVar12 * fVar39 + fVar11 * fVar41 + fVar10 * fVar37 + fVar9 * fVar35,
                            fVar12 * fVar38 + fVar11 * fVar40 + fVar10 * fVar36 + fVar9 * fVar34);
      local_128._4_4_ = fVar29 * fVar16 + fVar27 * fVar15 + fVar33 * fVar14 + fVar31 * fVar13;
      local_128._0_4_ = fVar28 * fVar16 + fVar26 * fVar15 + fVar32 * fVar14 + fVar30 * fVar13;
      fStack_11c = fVar16 * fVar39 + fVar15 * fVar41 + fVar14 * fVar37 + fVar13 * fVar35;
      fStack_120 = fVar16 * fVar38 + fVar15 * fVar40 + fVar14 * fVar36 + fVar13 * fVar34;
      local_118 = fVar28 * fVar20 + fVar26 * fVar19 + fVar32 * fVar18 + fVar30 * fVar17;
      fStack_114 = fVar29 * fVar20 + fVar27 * fVar19 + fVar33 * fVar18 + fVar31 * fVar17;
      fStack_110 = fVar20 * fVar38 + fVar19 * fVar40 + fVar18 * fVar36 + fVar17 * fVar34;
      fStack_10c = fVar20 * fVar39 + fVar19 * fVar41 + fVar18 * fVar37 + fVar17 * fVar35;
      local_108 = fVar28 * fVar3 + fVar26 * fVar2 + fVar32 * fVar1 + fVar30 * fVar21;
      fStack_104 = fVar29 * fVar3 + fVar27 * fVar2 + fVar33 * fVar1 + fVar31 * fVar21;
      fStack_100 = fVar3 * fVar38 + fVar2 * fVar40 + fVar1 * fVar36 + fVar21 * fVar34;
      fStack_fc = fVar3 * fVar39 + fVar2 * fVar41 + fVar1 * fVar37 + fVar21 * fVar35;
      vera::Shader::setUniform((Shader *)(lVar8 + 0x158),&local_f8,(mat4 *)local_138,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      lVar8 = *(long *)(p_Var24 + 2);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"u_modelMatrix","");
      pfVar22 = (float *)(**(code **)(**(long **)(p_Var24 + 2) + 0x100))();
      local_d8._0_4_ = (this->m_origin).m_transformMatrix.value[0].field_0;
      local_d8._4_4_ = (this->m_origin).m_transformMatrix.value[0].field_1;
      local_b8._0_4_ = (this->m_origin).m_transformMatrix.value[0].field_2;
      local_b8._4_4_ = (this->m_origin).m_transformMatrix.value[0].field_3;
      uStack_b0 = 0;
      uVar4 = (this->m_origin).m_transformMatrix.value[1].field_0;
      uVar6 = (this->m_origin).m_transformMatrix.value[1].field_1;
      local_c8._0_4_ = (this->m_origin).m_transformMatrix.value[1].field_2;
      local_c8._4_4_ = (this->m_origin).m_transformMatrix.value[1].field_3;
      uStack_c0 = 0;
      local_a8._0_4_ = (this->m_origin).m_transformMatrix.value[2].field_0;
      local_a8._4_4_ = (this->m_origin).m_transformMatrix.value[2].field_1;
      uStack_a0 = 0;
      local_48._0_4_ = (this->m_origin).m_transformMatrix.value[2].field_2;
      local_48._4_4_ = (this->m_origin).m_transformMatrix.value[2].field_3;
      uStack_40 = 0;
      uVar5 = (this->m_origin).m_transformMatrix.value[3].field_0;
      uVar7 = (this->m_origin).m_transformMatrix.value[3].field_1;
      local_58._0_4_ = (this->m_origin).m_transformMatrix.value[3].field_2;
      local_58._4_4_ = (this->m_origin).m_transformMatrix.value[3].field_3;
      uStack_50 = 0;
      fVar9 = *pfVar22;
      fVar10 = pfVar22[1];
      fVar11 = pfVar22[2];
      fVar12 = pfVar22[3];
      fVar13 = pfVar22[4];
      fVar14 = pfVar22[5];
      uStack_d0 = 0;
      fVar15 = pfVar22[6];
      fVar16 = pfVar22[7];
      fVar17 = pfVar22[8];
      fVar18 = pfVar22[9];
      fVar19 = pfVar22[10];
      fVar20 = pfVar22[0xb];
      fVar21 = pfVar22[0xc];
      fVar1 = pfVar22[0xd];
      fVar2 = pfVar22[0xe];
      fVar3 = pfVar22[0xf];
      local_138._4_4_ =
           (float)uVar7 * fVar12 +
           (float)local_a8._4_4_ * fVar11 + (float)uVar6 * fVar10 + (float)local_d8._4_4_ * fVar9;
      local_138._0_4_ =
           (float)uVar5 * fVar12 +
           (float)(undefined4)local_a8 * fVar11 +
           (float)uVar4 * fVar10 + (float)local_d8._0_4_ * fVar9;
      uStack_130 = CONCAT44(fVar12 * (float)local_58._4_4_ +
                            fVar11 * (float)local_48._4_4_ +
                            fVar10 * (float)local_c8._4_4_ + fVar9 * (float)local_b8._4_4_,
                            fVar12 * (float)(undefined4)local_58 +
                            fVar11 * (float)(undefined4)local_48 +
                            fVar10 * (float)(undefined4)local_c8 +
                            fVar9 * (float)(undefined4)local_b8);
      local_128._4_4_ =
           (float)uVar7 * fVar16 +
           (float)local_a8._4_4_ * fVar15 + (float)uVar6 * fVar14 + (float)local_d8._4_4_ * fVar13;
      local_128._0_4_ =
           (float)uVar5 * fVar16 +
           (float)(undefined4)local_a8 * fVar15 +
           (float)uVar4 * fVar14 + (float)local_d8._0_4_ * fVar13;
      fStack_11c = fVar16 * (float)local_58._4_4_ +
                   fVar15 * (float)local_48._4_4_ +
                   fVar14 * (float)local_c8._4_4_ + fVar13 * (float)local_b8._4_4_;
      fStack_120 = fVar16 * (float)(undefined4)local_58 +
                   fVar15 * (float)(undefined4)local_48 +
                   fVar14 * (float)(undefined4)local_c8 + fVar13 * (float)(undefined4)local_b8;
      local_118 = (float)uVar5 * fVar20 +
                  (float)(undefined4)local_a8 * fVar19 +
                  (float)uVar4 * fVar18 + (float)local_d8._0_4_ * fVar17;
      fStack_114 = (float)uVar7 * fVar20 +
                   (float)local_a8._4_4_ * fVar19 +
                   (float)uVar6 * fVar18 + (float)local_d8._4_4_ * fVar17;
      fStack_110 = fVar20 * (float)(undefined4)local_58 +
                   fVar19 * (float)(undefined4)local_48 +
                   fVar18 * (float)(undefined4)local_c8 + fVar17 * (float)(undefined4)local_b8;
      fStack_10c = fVar20 * (float)local_58._4_4_ +
                   fVar19 * (float)local_48._4_4_ +
                   fVar18 * (float)local_c8._4_4_ + fVar17 * (float)local_b8._4_4_;
      local_108 = (float)uVar5 * fVar3 +
                  (float)(undefined4)local_a8 * fVar2 +
                  (float)uVar4 * fVar1 + (float)local_d8._0_4_ * fVar21;
      fStack_104 = (float)uVar7 * fVar3 +
                   (float)local_a8._4_4_ * fVar2 +
                   (float)uVar6 * fVar1 + (float)local_d8._4_4_ * fVar21;
      fStack_100 = fVar3 * (float)(undefined4)local_58 +
                   fVar2 * (float)(undefined4)local_48 +
                   fVar1 * (float)(undefined4)local_c8 + fVar21 * (float)(undefined4)local_b8;
      fStack_fc = fVar3 * (float)local_58._4_4_ +
                  fVar2 * (float)local_48._4_4_ +
                  fVar1 * (float)local_c8._4_4_ + fVar21 * (float)local_b8._4_4_;
      vera::Shader::setUniform((Shader *)(lVar8 + 0x158),&local_98,(mat4 *)local_138,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      lVar8 = *(long *)(p_Var24 + 2);
      local_138 = (undefined1  [8])local_128;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"u_model","");
      vera::Shader::setUniform
                ((Shader *)(lVar8 + 0x158),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                 (this->m_origin).m_position.field_0.x +
                 (this->m_floor).super_Node.m_position.field_0.x,
                 (this->m_origin).m_position.field_1.y +
                 (this->m_floor).super_Node.m_position.field_1.y,
                 (this->m_origin).m_position.field_2.z +
                 (this->m_floor).super_Node.m_position.field_2.z);
      if (local_138 != (undefined1  [8])local_128) {
        operator_delete((void *)local_138,(long)local_128 + 1);
      }
      local_f8._M_dataplus._M_p = (pointer)0x0;
      if ((this->buffersFbo).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (this->buffersFbo).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        do {
          lVar8 = *(long *)(p_Var24 + 2);
          vera::toString<unsigned_long>(&local_98,(unsigned_long *)&local_f8);
          plVar23 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x2dfd9d);
          psVar25 = (size_type *)(plVar23 + 2);
          if ((size_type *)*plVar23 == psVar25) {
            local_128 = (undefined1  [8])*psVar25;
            _fStack_120 = plVar23[3];
            local_138 = (undefined1  [8])local_128;
          }
          else {
            local_128 = (undefined1  [8])*psVar25;
            local_138 = (undefined1  [8])*plVar23;
          }
          uStack_130 = plVar23[1];
          *plVar23 = (long)psVar25;
          plVar23[1] = 0;
          *(undefined1 *)(plVar23 + 2) = 0;
          _fbo = (this->buffersFbo).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[(long)local_f8._M_dataplus._M_p];
          _texLoc = *(size_t *)(*(long *)(p_Var24 + 2) + 0x198);
          *(size_t *)(*(long *)(p_Var24 + 2) + 0x198) = _texLoc + 1;
          vera::Shader::setUniformTexture
                    ((Shader *)(lVar8 + 0x158),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                     _fbo,_texLoc);
          if (local_138 != (undefined1  [8])local_128) {
            operator_delete((void *)local_138,(long)local_128 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          local_f8._M_dataplus._M_p = local_f8._M_dataplus._M_p + 1;
        } while (local_f8._M_dataplus._M_p <
                 (pointer)((long)(this->buffersFbo).
                                 super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->buffersFbo).
                                 super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3));
      }
      vera::Model::render(*(Model **)(p_Var24 + 2));
      if ((_uniforms->tracker).m_running != false) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_138,"render:scene:",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (*(long *)(p_Var24 + 2) + 0x2b0));
        Tracker::end(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_138);
        if (local_138 != (undefined1  [8])local_128) {
          operator_delete((void *)local_138,(long)local_128 + 1);
        }
      }
      p_Var24 = (_Base_ptr)std::_Rb_tree_increment(p_Var24);
    } while (p_Var24 != local_38);
  }
  if ((_uniforms->tracker).m_running != false) {
    local_138 = (undefined1  [8])local_128;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"render:scene:devlook","");
    Tracker::begin(this_00,(string *)local_138);
    if (local_138 != (undefined1  [8])local_128) {
      operator_delete((void *)local_138,(long)local_128 + 1);
    }
  }
  renderDevLook(this,_uniforms);
  if ((_uniforms->tracker).m_running == true) {
    local_138 = (undefined1  [8])local_128;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"render:scene:devlook","");
    Tracker::end(this_00,(string *)local_138);
    if (local_138 != (undefined1  [8])local_128) {
      operator_delete((void *)local_138,(long)local_128 + 1);
    }
  }
  if (this->m_depth_test == true) {
    glDisable(0xb71);
  }
  if (this->m_blend != BLEND_NONE) {
    vera::blendMode(BLEND_ALPHA);
  }
  if (this->m_culling != CULL_NONE) {
    glDisable(0xb44);
  }
  return;
}

Assistant:

void SceneRender::render(Uniforms& _uniforms) {
    // Render Background
    renderBackground(_uniforms);

    // Begining of DEPTH for 3D 
    if (m_depth_test)
        glEnable(GL_DEPTH_TEST);

    vera::blendMode(m_blend);

    if (_uniforms.activeCamera->bChange || m_origin.bChange) {
        vera::setCamera( _uniforms.activeCamera );
        vera::applyMatrix( m_origin.getTransformMatrix() );
    }

    TRACK_BEGIN("render:scene:floor")
    renderFloor(_uniforms );
    TRACK_END("render:scene:floor")

    vera::cullingMode(m_culling);

    for (vera::ModelsMap::iterator it = _uniforms.models.begin(); it != _uniforms.models.end(); ++it) {
        TRACK_BEGIN("render:scene:" + it->second->getName() )

        // bind the shader
        it->second->getShader()->use();

        // Update Uniforms and textures variables to the shader
        _uniforms.feedTo( it->second->getShader(), true, true );

        // Pass special uniforms
        it->second->getShader()->setUniform( "u_modelViewProjectionMatrix", vera::getProjectionViewWorldMatrix() * it->second->getTransformMatrix() );
        it->second->getShader()->setUniform( "u_modelMatrix", m_origin.getTransformMatrix() * it->second->getTransformMatrix() );
        it->second->getShader()->setUniform( "u_model", m_origin.getPosition() + m_floor.getPosition() );

        for (size_t i = 0; i < buffersFbo.size(); i++)
            it->second->getShader()->setUniformTexture("u_sceneBuffer" + vera::toString(i), buffersFbo[i], it->second->getShader()->textureIndex++);

        it->second->render();

        TRACK_END("render:scene:" + it->second->getName() )
    }

    TRACK_BEGIN("render:scene:devlook")
    renderDevLook(_uniforms);
    TRACK_END("render:scene:devlook")

    if (m_depth_test)
        glDisable(GL_DEPTH_TEST);

    if (m_blend != 0)
        vera::blendMode(vera::BLEND_ALPHA);

    if (m_culling != 0)
        glDisable(GL_CULL_FACE);
}